

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O1

long cm_zlib_gzseek(gzFile file,long offset,int whence)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = -1;
  if ((whence != 2 && file != (gzFile)0x0) && ((*(uint *)((long)file + 0x70) | 2) != 0xffffffff)) {
    if (*(char *)((long)file + 0xac) == 'w') {
      if (whence == 0) {
        offset = offset - *(long *)((long)file + 0xb8);
      }
      if (-1 < offset) {
        if (*(long *)((long)file + 0x80) == 0) {
          pvVar3 = malloc(0x4000);
          *(void **)((long)file + 0x80) = pvVar3;
          if (pvVar3 == (void *)0x0) {
            return -1;
          }
          memset(pvVar3,0,0x4000);
        }
        do {
          if (offset < 1) {
            return *(long *)((long)file + 0xb8);
          }
          lVar4 = 0x4000;
          if (offset < 0x4000) {
            lVar4 = offset;
          }
          uVar1 = cm_zlib_gzwrite(file,*(voidpc *)((long)file + 0x80),(uint)lVar4);
          offset = offset - (ulong)uVar1;
        } while (uVar1 != 0);
      }
    }
    else {
      if (whence == 1) {
        offset = offset + *(long *)((long)file + 0xc0);
      }
      if (-1 < offset) {
        if (*(int *)((long)file + 0xa8) == 0) {
          lVar4 = offset - *(long *)((long)file + 0xc0);
          if ((*(long *)((long)file + 0xc0) <= offset) ||
             (iVar2 = cm_zlib_gzrewind(file), lVar4 = offset, -1 < iVar2)) {
            if (lVar4 == 0) {
              lVar4 = 0;
            }
            else {
              if (*(long *)((long)file + 0x88) == 0) {
                pvVar3 = malloc(0x4000);
                *(void **)((long)file + 0x88) = pvVar3;
                if (pvVar3 == (void *)0x0) {
                  return -1;
                }
              }
              if (*(int *)((long)file + 200) != -1) {
                *(undefined4 *)((long)file + 200) = 0xffffffff;
                *(long *)((long)file + 0xc0) = *(long *)((long)file + 0xc0) + 1;
                lVar4 = lVar4 + -1;
                if (*(int *)((long)file + 0xcc) != 0) {
                  *(undefined4 *)((long)file + 0x70) = 1;
                }
              }
            }
            do {
              if (lVar4 < 1) {
                return *(long *)((long)file + 0xc0);
              }
              lVar6 = 0x4000;
              if (lVar4 < 0x4000) {
                lVar6 = lVar4;
              }
              uVar1 = cm_zlib_gzread(file,*(voidp *)((long)file + 0x88),(uint)lVar6);
              uVar5 = 0;
              if (0 < (int)uVar1) {
                uVar5 = (ulong)uVar1;
              }
              lVar4 = lVar4 - uVar5;
            } while (0 < (int)uVar1);
          }
        }
        else {
          *(undefined4 *)((long)file + 200) = 0xffffffff;
          *(undefined4 *)((long)file + 8) = 0;
          *(undefined8 *)file = *(undefined8 *)((long)file + 0x80);
          iVar2 = fseek(*(FILE **)((long)file + 0x78),offset,0);
          if (-1 < iVar2) {
            *(long *)((long)file + 0xc0) = offset;
            *(long *)((long)file + 0xb8) = offset;
            lVar7 = offset;
          }
        }
      }
    }
  }
  return lVar7;
}

Assistant:

z_off_t ZEXPORT gzseek (file, offset, whence)
    gzFile file;
    z_off_t offset;
    int whence;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || whence == SEEK_END ||
        s->z_err == Z_ERRNO || s->z_err == Z_DATA_ERROR) {
        return -1L;
    }

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        return -1L;
#else
        if (whence == SEEK_SET) {
            offset -= s->in;
        }
        if (offset < 0) return -1L;

        /* At this point, offset is the number of zero bytes to write. */
        if (s->inbuf == Z_NULL) {
            s->inbuf = (Byte*)ALLOC(Z_BUFSIZE); /* for seeking */
            if (s->inbuf == Z_NULL) return -1L;
            zmemzero(s->inbuf, Z_BUFSIZE);
        }
        while (offset > 0)  {
            uInt size = Z_BUFSIZE;
            if (offset < Z_BUFSIZE) size = (uInt)offset;

            size = gzwrite(file, s->inbuf, size);
            if (size == 0) return -1L;

            offset -= size;
        }
        return s->in;
#endif
    }
    /* Rest of function is for reading only */

    /* compute absolute position */
    if (whence == SEEK_CUR) {
        offset += s->out;
    }
    if (offset < 0) return -1L;

    if (s->transparent) {
        /* map to fseek */
        s->back = EOF;
        s->stream.avail_in = 0;
        s->stream.next_in = s->inbuf;
        if (fseek(s->file, offset, SEEK_SET) < 0) return -1L;

        s->in = s->out = offset;
        return offset;
    }

    /* For a negative seek, rewind and use positive seek */
    if (offset >= s->out) {
        offset -= s->out;
    } else if (gzrewind(file) < 0) {
        return -1L;
    }
    /* offset is now the number of bytes to skip. */

    if (offset != 0 && s->outbuf == Z_NULL) {
        s->outbuf = (Byte*)ALLOC(Z_BUFSIZE);
        if (s->outbuf == Z_NULL) return -1L;
    }
    if (offset && s->back != EOF) {
        s->back = EOF;
        s->out++;
        offset--;
        if (s->last) s->z_err = Z_STREAM_END;
    }
    while (offset > 0)  {
        int size = Z_BUFSIZE;
        if (offset < Z_BUFSIZE) size = (int)offset;

        size = gzread(file, s->outbuf, (uInt)size);
        if (size <= 0) return -1L;
        offset -= size;
    }
    return s->out;
}